

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O2

shared_ptr<cppnet::BufferBlock> __thiscall
cppnet::AlloterWrap::PoolNewSharePtr<cppnet::BufferBlock,std::shared_ptr<cppnet::BlockMemoryPool>&>
          (AlloterWrap *this,shared_ptr<cppnet::BlockMemoryPool> *args)

{
  BufferBlock *__p;
  shared_ptr<cppnet::BlockMemoryPool> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppnet::BufferBlock> sVar1;
  
  __p = PoolNew<cppnet::BufferBlock,std::shared_ptr<cppnet::BlockMemoryPool>&>
                  ((AlloterWrap *)args,in_RDX);
  std::__shared_ptr<cppnet::BufferBlock,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::BufferBlock,cppnet::AlloterWrap::PoolNewSharePtr<cppnet::BufferBlock,std::shared_ptr<cppnet::BlockMemoryPool>&>(std::shared_ptr<cppnet::BlockMemoryPool>&)::_lambda(cppnet::BufferBlock*)_1_,void>
            ((__shared_ptr<cppnet::BufferBlock,(__gnu_cxx::_Lock_policy)2> *)this,__p,
             (anon_class_8_1_8991fb9c_for__M_tp)args);
  sVar1.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BufferBlock>)
         sVar1.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> AlloterWrap::PoolNewSharePtr(Args&&... args) {
    T* ret = PoolNew<T>(std::forward<Args>(args)...);
    return std::shared_ptr<T>(ret, [this](T* c) { PoolDelete(c); });
}